

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

bool __thiscall
deqp::egl::Image::GLES2ImageApi::RenderTexture2D::invokeGLES2
          (RenderTexture2D *this,GLES2ImageApi *api,
          MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *img,
          Texture2D *reference)

{
  Functions *gl_00;
  glViewportFunc p_Var1;
  glBindTextureFunc p_Var2;
  Library *egl;
  glReadPixelsFunc p_Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  deBool dVar7;
  deUint32 dVar8;
  GLenum GVar9;
  GLuint GVar10;
  GLint GVar11;
  TextureFormat *pTVar12;
  IllegalRendererException *pIVar13;
  MessageBuilder *pMVar14;
  UniqueImage *pUVar15;
  EGLImage pvVar16;
  TestError *pTVar17;
  void *pvVar18;
  EVP_PKEY_CTX *src;
  undefined1 local_350 [3];
  bool match;
  float threshold;
  PixelBufferAccess local_328;
  undefined1 local_300 [8];
  Surface screen;
  Surface refSurface;
  GLuint samplerLoc;
  GLuint coordLoc;
  GLuint glProgram;
  Program program;
  char *fragmentShader;
  char *vertexShader;
  undefined1 local_50 [8];
  Texture srcTex;
  TestLog *log;
  Functions *gl;
  Texture2D *reference_local;
  MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *img_local;
  GLES2ImageApi *api_local;
  RenderTexture2D *this_local;
  
  gl_00 = api->m_gl;
  srcTex.super_ObjectWrapper._16_8_ = glu::CallLogWrapper::getLog(&api->super_CallLogWrapper);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_50,gl_00);
  pTVar12 = tcu::TextureLevelPyramid::getFormat(&reference->super_TextureLevelPyramid);
  if ((pTVar12->order == DS) ||
     (pTVar12 = tcu::TextureLevelPyramid::getFormat(&reference->super_TextureLevelPyramid),
     pTVar12->order == D)) {
    pIVar13 = (IllegalRendererException *)__cxa_allocate_exception(8);
    *pIVar13 = (IllegalRendererException)0x0;
    IllegalRendererException::IllegalRendererException(pIVar13);
    __cxa_throw(pIVar13,&IllegalRendererException::typeinfo,
                IllegalRendererException::~IllegalRendererException);
  }
  pTVar12 = tcu::TextureLevelPyramid::getFormat(&reference->super_TextureLevelPyramid);
  if (pTVar12->order == S) {
    pIVar13 = (IllegalRendererException *)__cxa_allocate_exception(8);
    *pIVar13 = (IllegalRendererException)0x0;
    IllegalRendererException::IllegalRendererException(pIVar13);
    __cxa_throw(pIVar13,&IllegalRendererException::typeinfo,
                IllegalRendererException::~IllegalRendererException);
  }
  (*gl_00->clearColor)(0.0,0.0,0.0,0.0);
  p_Var1 = gl_00->viewport;
  iVar5 = tcu::Texture2D::getWidth(reference);
  iVar6 = tcu::Texture2D::getHeight(reference);
  (*p_Var1)(0,0,iVar5,iVar6);
  (*gl_00->clear)(0x4100);
  (*gl_00->disable)(0xb71);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&vertexShader,(TestLog *)srcTex.super_ObjectWrapper._16_8_,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar14 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&vertexShader,
                       (char (*) [49])"Rendering EGLImage as GL_TEXTURE_2D in context: ");
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&(api->super_ImageApi).m_contextId);
  tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&vertexShader);
  while (dVar7 = ::deGetFalse(), dVar7 == 0) {
    pUVar15 = de::details::UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>::
              operator*(&img->
                         super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>
                       );
    pvVar16 = eglu::UniqueImage::operator*(pUVar15);
    if (pvVar16 == (EGLImage)0x0) break;
    dVar7 = ::deGetFalse();
    if (dVar7 == 0) {
      do {
        p_Var2 = gl_00->bindTexture;
        dVar8 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_50);
        (*p_Var2)(0xde1,dVar8);
        GVar9 = (*gl_00->getError)();
        glu::checkError(GVar9,"bindTexture(GL_TEXTURE_2D, *srcTex)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,0x18c);
        dVar7 = ::deGetFalse();
      } while (dVar7 != 0);
      egl = (api->super_ImageApi).m_egl;
      pUVar15 = de::details::UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>::
                operator*(&img->
                           super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>
                         );
      pvVar16 = eglu::UniqueImage::operator*(pUVar15);
      imageTargetTexture2D(egl,gl_00,pvVar16);
      do {
        (*gl_00->texParameteri)(0xde1,0x2801,0x2600);
        GVar9 = (*gl_00->getError)();
        glu::checkError(GVar9,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,399);
        dVar7 = ::deGetFalse();
      } while (dVar7 != 0);
      do {
        (*gl_00->texParameteri)(0xde1,0x2800,0x2600);
        GVar9 = (*gl_00->getError)();
        glu::checkError(GVar9,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,400);
        dVar7 = ::deGetFalse();
      } while (dVar7 != 0);
      do {
        (*gl_00->texParameteri)(0xde1,0x2803,0x812f);
        GVar9 = (*gl_00->getError)();
        glu::checkError(GVar9,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,0x191);
        dVar7 = ::deGetFalse();
      } while (dVar7 != 0);
      do {
        (*gl_00->texParameteri)(0xde1,0x2802,0x812f);
        GVar9 = (*gl_00->getError)();
        glu::checkError(GVar9,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,0x192);
        dVar7 = ::deGetFalse();
      } while (dVar7 != 0);
      program.super_ShaderProgram.m_program.m_info.linkTimeUs = (deUint64)anon_var_dwarf_c52b91;
      anon_unknown_1::Program::Program
                ((Program *)&coordLoc,gl_00,
                 "attribute highp vec2 a_coord;\nvarying mediump vec2 v_texCoord;\nvoid main(void) {\n\tv_texCoord = vec2((a_coord.x + 1.0) * 0.5, (a_coord.y + 1.0) * 0.5);\n\tgl_Position = vec4(a_coord, -0.1, 1.0);\n}\n"
                 ,
                 "varying mediump vec2 v_texCoord;\nuniform sampler2D u_sampler;\nvoid main(void) {\n\tmediump vec4 texColor = texture2D(u_sampler, v_texCoord);\n\tgl_FragColor = vec4(texColor);\n}"
                );
      while ((dVar7 = ::deGetFalse(), dVar7 == 0 &&
             (bVar4 = glu::ShaderProgram::isOk((ShaderProgram *)&coordLoc), bVar4))) {
        dVar7 = ::deGetFalse();
        if (dVar7 == 0) {
          dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)&coordLoc);
          do {
            (*gl_00->useProgram)(dVar8);
            GVar9 = (*gl_00->getError)();
            glu::checkError(GVar9,"useProgram(glProgram)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                            ,0x1a8);
            dVar7 = ::deGetFalse();
          } while (dVar7 != 0);
          GVar10 = (*gl_00->getAttribLocation)(dVar8,"a_coord");
          while ((dVar7 = ::deGetFalse(), dVar7 == 0 && (GVar10 != 0xffffffff))) {
            dVar7 = ::deGetFalse();
            if (dVar7 == 0) {
              GVar11 = (*gl_00->getUniformLocation)(dVar8,"u_sampler");
              while ((dVar7 = ::deGetFalse(), dVar7 == 0 && (GVar11 != -1))) {
                dVar7 = ::deGetFalse();
                if (dVar7 == 0) {
                  do {
                    p_Var2 = gl_00->bindTexture;
                    dVar8 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_50);
                    (*p_Var2)(0xde1,dVar8);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"bindTexture(GL_TEXTURE_2D, *srcTex)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x1b0);
                    dVar7 = ::deGetFalse();
                  } while (dVar7 != 0);
                  do {
                    (*gl_00->uniform1i)(GVar11,0);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"uniform1i(samplerLoc, 0)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x1b1);
                    dVar7 = ::deGetFalse();
                  } while (dVar7 != 0);
                  do {
                    (*gl_00->enableVertexAttribArray)(GVar10);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"enableVertexAttribArray(coordLoc)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x1b2);
                    dVar7 = ::deGetFalse();
                  } while (dVar7 != 0);
                  do {
                    (*gl_00->vertexAttribPointer)(GVar10,2,0x1406,'\0',0,squareTriangleCoords);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,
                                    "vertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, squareTriangleCoords)"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x1b3);
                    dVar7 = ::deGetFalse();
                  } while (dVar7 != 0);
                  do {
                    (*gl_00->drawArrays)(4,0,6);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"drawArrays(GL_TRIANGLES, 0, 6)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x1b5);
                    dVar7 = ::deGetFalse();
                  } while (dVar7 != 0);
                  do {
                    (*gl_00->disableVertexAttribArray)(GVar10);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"disableVertexAttribArray(coordLoc)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x1b6);
                    dVar7 = ::deGetFalse();
                  } while (dVar7 != 0);
                  do {
                    (*gl_00->bindTexture)(0xde1,0);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"bindTexture(GL_TEXTURE_2D, 0)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x1b7);
                    dVar7 = ::deGetFalse();
                  } while (dVar7 != 0);
                  iVar5 = tcu::Texture2D::getWidth(reference);
                  iVar6 = tcu::Texture2D::getHeight(reference);
                  tcu::Surface::Surface((Surface *)&screen.m_pixels.m_cap,iVar5,iVar6);
                  iVar5 = tcu::Texture2D::getWidth(reference);
                  iVar6 = tcu::Texture2D::getHeight(reference);
                  tcu::Surface::Surface((Surface *)local_300,iVar5,iVar6);
                  do {
                    p_Var3 = gl_00->readPixels;
                    iVar5 = tcu::Surface::getWidth((Surface *)local_300);
                    iVar6 = tcu::Surface::getHeight((Surface *)local_300);
                    tcu::Surface::getAccess(&local_328,(Surface *)local_300);
                    pvVar18 = tcu::PixelBufferAccess::getDataPtr(&local_328);
                    (*p_Var3)(0,0,iVar5,iVar6,0x1908,0x1401,pvVar18);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,
                                    "readPixels(0, 0, screen.getWidth(), screen.getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen.getAccess().getDataPtr())"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x1bb);
                    dVar7 = ::deGetFalse();
                  } while (dVar7 != 0);
                  tcu::Surface::getAccess
                            ((PixelBufferAccess *)local_350,(Surface *)&screen.m_pixels.m_cap);
                  src = (EVP_PKEY_CTX *)
                        tcu::TextureLevelPyramid::getLevel(&reference->super_TextureLevelPyramid,0);
                  tcu::copy((EVP_PKEY_CTX *)local_350,src);
                  bVar4 = tcu::fuzzyCompare((TestLog *)srcTex.super_ObjectWrapper._16_8_,
                                            "ComparisonResult","Image comparison result",
                                            (Surface *)&screen.m_pixels.m_cap,(Surface *)local_300,
                                            0.05,COMPARE_LOG_RESULT);
                  tcu::Surface::~Surface((Surface *)local_300);
                  tcu::Surface::~Surface((Surface *)&screen.m_pixels.m_cap);
                  anon_unknown_1::Program::~Program((Program *)&coordLoc);
                  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
                            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_50);
                  return bVar4;
                }
              }
              pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar17,"Couldn\'t find uniform u_sampler","(int)samplerLoc != (int)-1",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                         ,0x1ae);
              __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
          }
          pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar17,"Couldn\'t find attribute a_coord","(int)coordLoc != -1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                     ,0x1ab);
          __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar17,(char *)0x0,"program.isOk()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                 ,0x1a5);
      __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar17,(char *)0x0,"**img != EGL_NO_IMAGE_KHR",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
             ,0x18a);
  __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool GLES2ImageApi::RenderTexture2D::invokeGLES2 (GLES2ImageApi& api, MovePtr<UniqueImage>& img, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl		= api.m_gl;
	tcu::TestLog&			log		= api.getLog();
	Texture					srcTex	(gl);

	// Branch only taken in TryAll case
	if (reference.getFormat().order == tcu::TextureFormat::DS || reference.getFormat().order == tcu::TextureFormat::D)
		throw IllegalRendererException(); // Skip, GLES2 does not support sampling depth textures
	if (reference.getFormat().order == tcu::TextureFormat::S)
		throw IllegalRendererException(); // Skip, GLES2 does not support sampling stencil textures

	gl.clearColor(0.0, 0.0, 0.0, 0.0);
	gl.viewport(0, 0, reference.getWidth(), reference.getHeight());
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT);
	gl.disable(GL_DEPTH_TEST);

	log << tcu::TestLog::Message << "Rendering EGLImage as GL_TEXTURE_2D in context: " << api.m_contextId << tcu::TestLog::EndMessage;
	TCU_CHECK(**img != EGL_NO_IMAGE_KHR);

	GLU_CHECK_GLW_CALL(gl, bindTexture(GL_TEXTURE_2D, *srcTex));
	imageTargetTexture2D(api.m_egl, gl, **img);

	GLU_CHECK_GLW_CALL(gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST));
	GLU_CHECK_GLW_CALL(gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST));
	GLU_CHECK_GLW_CALL(gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE));
	GLU_CHECK_GLW_CALL(gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE));

	const char* const vertexShader =
		"attribute highp vec2 a_coord;\n"
		"varying mediump vec2 v_texCoord;\n"
		"void main(void) {\n"
		"\tv_texCoord = vec2((a_coord.x + 1.0) * 0.5, (a_coord.y + 1.0) * 0.5);\n"
		"\tgl_Position = vec4(a_coord, -0.1, 1.0);\n"
		"}\n";

	const char* const fragmentShader =
		"varying mediump vec2 v_texCoord;\n"
		"uniform sampler2D u_sampler;\n"
		"void main(void) {\n"
		"\tmediump vec4 texColor = texture2D(u_sampler, v_texCoord);\n"
		"\tgl_FragColor = vec4(texColor);\n"
		"}";

	Program program(gl, vertexShader, fragmentShader);
	TCU_CHECK(program.isOk());

	GLuint glProgram = program.getProgram();
	GLU_CHECK_GLW_CALL(gl, useProgram(glProgram));

	GLuint coordLoc = gl.getAttribLocation(glProgram, "a_coord");
	TCU_CHECK_MSG((int)coordLoc != -1, "Couldn't find attribute a_coord");

	GLuint samplerLoc = gl.getUniformLocation(glProgram, "u_sampler");
	TCU_CHECK_MSG((int)samplerLoc != (int)-1, "Couldn't find uniform u_sampler");

	GLU_CHECK_GLW_CALL(gl, bindTexture(GL_TEXTURE_2D, *srcTex));
	GLU_CHECK_GLW_CALL(gl, uniform1i(samplerLoc, 0));
	GLU_CHECK_GLW_CALL(gl, enableVertexAttribArray(coordLoc));
	GLU_CHECK_GLW_CALL(gl, vertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, squareTriangleCoords));

	GLU_CHECK_GLW_CALL(gl, drawArrays(GL_TRIANGLES, 0, 6));
	GLU_CHECK_GLW_CALL(gl, disableVertexAttribArray(coordLoc));
	GLU_CHECK_GLW_CALL(gl, bindTexture(GL_TEXTURE_2D, 0));

	tcu::Surface refSurface	(reference.getWidth(), reference.getHeight());
	tcu::Surface screen		(reference.getWidth(), reference.getHeight());
	GLU_CHECK_GLW_CALL(gl, readPixels(0, 0, screen.getWidth(), screen.getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen.getAccess().getDataPtr()));

	tcu::copy(refSurface.getAccess(), reference.getLevel(0));

	float	threshold	= 0.05f;
	bool	match		= tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refSurface, screen, threshold, tcu::COMPARE_LOG_RESULT);

	return match;
}